

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpca_grammar_st(char *grammar,mpca_grammar_st_t *st)

{
  int iVar1;
  mpc_result_t *pmVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  mpc_parser_t *pmVar5;
  mpc_parser_t *pmVar6;
  mpc_parser_t *pmVar7;
  mpc_err_t *x;
  mpc_parser_t *pmVar8;
  mpc_parser_t *pmVar9;
  mpc_parser_t *pmVar10;
  mpc_parser_t *pmVar11;
  mpc_parser_t *pmVar12;
  char *__ptr;
  long in_RSI;
  mpc_parser_t *Base;
  mpc_parser_t *Factor;
  mpc_parser_t *Term;
  mpc_parser_t *Grammar;
  mpc_parser_t *GrammarTotal;
  mpc_result_t r;
  mpc_parser_t *err_out;
  char *err_msg;
  mpc_parser_t *in_stack_ffffffffffffff08;
  code *a;
  mpc_err_t *in_stack_ffffffffffffff10;
  mpc_result_t *r_00;
  mpc_parser_t *a_00;
  mpc_parser_t *string;
  mpc_parser_t *local_28;
  
  pmVar2 = (mpc_result_t *)mpc_new((char *)in_stack_ffffffffffffff10);
  pmVar3 = mpc_new((char *)in_stack_ffffffffffffff10);
  pmVar4 = mpc_new((char *)in_stack_ffffffffffffff10);
  pmVar5 = mpc_new((char *)in_stack_ffffffffffffff10);
  pmVar6 = mpc_new((char *)in_stack_ffffffffffffff10);
  r_00 = pmVar2;
  mpc_total((mpc_parser_t *)in_stack_ffffffffffffff10,(mpc_dtor_t)in_stack_ffffffffffffff08);
  mpc_predictive((mpc_parser_t *)in_stack_ffffffffffffff10);
  mpc_define((mpc_parser_t *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  a_00 = pmVar4;
  string = pmVar3;
  pmVar7 = mpc_sym((char *)0x29cdd7);
  mpc_and(2,mpcf_snd_free,pmVar7,pmVar3,free);
  pmVar7 = mpc_maybe((mpc_parser_t *)0x29ce04);
  mpc_and(2,mpcaf_grammar_or,a_00,pmVar7,mpc_soft_delete);
  mpc_define((mpc_parser_t *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  pmVar7 = pmVar4;
  mpc_many1((mpc_fold_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  mpc_define((mpc_parser_t *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  x = (mpc_err_t *)mpc_sym((char *)0x29ce87);
  pmVar8 = mpc_sym((char *)0x29ce98);
  pmVar9 = mpc_sym((char *)0x29cea9);
  pmVar10 = mpc_sym((char *)0x29ceba);
  mpc_int();
  pmVar11 = mpc_tok_brackets((mpc_parser_t *)in_stack_ffffffffffffff10,
                             (mpc_dtor_t)in_stack_ffffffffffffff08);
  pmVar12 = mpc_pass();
  pmVar8 = mpc_or(6,x,pmVar8,pmVar9,pmVar10,pmVar11);
  mpc_and(2,mpcaf_grammar_repeat,pmVar6,pmVar8,mpc_soft_delete);
  mpc_define((mpc_parser_t *)in_stack_ffffffffffffff10,pmVar12);
  mpc_string_lit();
  mpc_tok((mpc_parser_t *)in_stack_ffffffffffffff10);
  pmVar8 = mpc_apply_to(a_00,(mpc_apply_to_t)r_00,in_stack_ffffffffffffff10);
  mpc_char_lit();
  mpc_tok((mpc_parser_t *)in_stack_ffffffffffffff10);
  pmVar9 = mpc_apply_to(a_00,(mpc_apply_to_t)r_00,in_stack_ffffffffffffff10);
  pmVar10 = mpc_regex_lit();
  mpc_oneof((char *)in_stack_ffffffffffffff10);
  pmVar11 = mpc_many((mpc_fold_t)in_stack_ffffffffffffff10,pmVar12);
  pmVar12 = mpc_lift_val(in_stack_ffffffffffffff10);
  a = free;
  mpc_and(3,mpcaf_fold_regex,pmVar10,pmVar11,pmVar12,free);
  pmVar10 = mpc_tok((mpc_parser_t *)in_stack_ffffffffffffff10);
  pmVar11 = mpc_digits();
  pmVar12 = mpc_ident();
  mpc_or(2,pmVar11,pmVar12);
  mpc_tok_braces((mpc_parser_t *)in_stack_ffffffffffffff10,a);
  pmVar11 = mpc_apply_to(a_00,(mpc_apply_to_t)r_00,in_stack_ffffffffffffff10);
  pmVar12 = mpc_tok_parens((mpc_parser_t *)in_stack_ffffffffffffff10,a);
  mpc_or(5,pmVar8,pmVar9,pmVar10,pmVar11,pmVar12);
  mpc_define((mpc_parser_t *)in_stack_ffffffffffffff10,(mpc_parser_t *)a);
  mpc_optimise((mpc_parser_t *)0x29d0c3);
  mpc_optimise((mpc_parser_t *)0x29d0d0);
  mpc_optimise((mpc_parser_t *)0x29d0dd);
  mpc_optimise((mpc_parser_t *)0x29d0ea);
  mpc_optimise((mpc_parser_t *)0x29d0f7);
  iVar1 = mpc_parse((char *)pmVar7,(char *)string,a_00,r_00);
  if (iVar1 == 0) {
    __ptr = mpc_err_string(x);
    local_28 = mpc_failf("Invalid Grammar: %s",__ptr);
    mpc_err_delete(in_stack_ffffffffffffff10);
    free(__ptr);
  }
  mpc_cleanup(5,pmVar2,pmVar3,pmVar4,pmVar5,pmVar6);
  mpc_optimise((mpc_parser_t *)0x29d1be);
  if ((*(uint *)(in_RSI + 0x18) & 1) != 0) {
    local_28 = mpc_predictive((mpc_parser_t *)in_stack_ffffffffffffff10);
  }
  return local_28;
}

Assistant:

mpc_parser_t *mpca_grammar_st(const char *grammar, mpca_grammar_st_t *st) {

  char *err_msg;
  mpc_parser_t *err_out;
  mpc_result_t r;
  mpc_parser_t *GrammarTotal, *Grammar, *Term, *Factor, *Base;

  GrammarTotal = mpc_new("grammar_total");
  Grammar = mpc_new("grammar");
  Term = mpc_new("term");
  Factor = mpc_new("factor");
  Base = mpc_new("base");

  mpc_define(GrammarTotal,
    mpc_predictive(mpc_total(Grammar, mpc_soft_delete))
  );

  mpc_define(Grammar, mpc_and(2, mpcaf_grammar_or,
    Term,
    mpc_maybe(mpc_and(2, mpcf_snd_free, mpc_sym("|"), Grammar, free)),
    mpc_soft_delete
  ));

  mpc_define(Term, mpc_many1(mpcaf_grammar_and, Factor));

  mpc_define(Factor, mpc_and(2, mpcaf_grammar_repeat,
    Base,
      mpc_or(6,
        mpc_sym("*"),
        mpc_sym("+"),
        mpc_sym("?"),
        mpc_sym("!"),
        mpc_tok_brackets(mpc_int(), free),
        mpc_pass()),
    mpc_soft_delete
  ));

  mpc_define(Base, mpc_or(5,
    mpc_apply_to(mpc_tok(mpc_string_lit()), mpcaf_grammar_string, st),
    mpc_apply_to(mpc_tok(mpc_char_lit()),   mpcaf_grammar_char, st),
    mpc_tok(mpc_and(3, mpcaf_fold_regex, mpc_regex_lit(), mpc_many(mpcf_strfold, mpc_oneof("ms")), mpc_lift_val(st), free, free)),
    mpc_apply_to(mpc_tok_braces(mpc_or(2, mpc_digits(), mpc_ident()), free), mpcaf_grammar_id, st),
    mpc_tok_parens(Grammar, mpc_soft_delete)
  ));

  mpc_optimise(GrammarTotal);
  mpc_optimise(Grammar);
  mpc_optimise(Factor);
  mpc_optimise(Term);
  mpc_optimise(Base);

  if(!mpc_parse("<mpc_grammar_compiler>", grammar, GrammarTotal, &r)) {
    err_msg = mpc_err_string(r.error);
    err_out = mpc_failf("Invalid Grammar: %s", err_msg);
    mpc_err_delete(r.error);
    free(err_msg);
    r.output = err_out;
  }

  mpc_cleanup(5, GrammarTotal, Grammar, Term, Factor, Base);

  mpc_optimise(r.output);

  return (st->flags & MPCA_LANG_PREDICTIVE) ? mpc_predictive(r.output) : r.output;

}